

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_u32string_equal_string_literal(void)

{
  undefined1 local_819;
  basic_variable<std::allocator<char>_> local_818;
  undefined1 local_7db [2];
  undefined1 local_7d9;
  basic_variable<std::allocator<char>_> local_7d8;
  undefined1 local_79b [2];
  undefined1 local_799;
  basic_variable<std::allocator<char>_> local_798;
  undefined1 local_75b [2];
  undefined1 local_759;
  basic_variable<std::allocator<char>_> local_758;
  undefined1 local_71b [2];
  undefined1 local_719;
  basic_variable<std::allocator<char>_> local_718;
  undefined1 local_6db [2];
  undefined1 local_6d9;
  basic_variable<std::allocator<char>_> local_6d8;
  undefined1 local_69b [2];
  undefined1 local_699;
  basic_variable<std::allocator<char>_> local_698;
  undefined1 local_65b [2];
  undefined1 local_659;
  basic_variable<std::allocator<char>_> local_658;
  undefined1 local_61b [2];
  undefined1 local_619;
  basic_variable<std::allocator<char>_> local_618;
  undefined1 local_5db [2];
  undefined1 local_5d9;
  basic_variable<std::allocator<char>_> local_5d8;
  undefined1 local_59b [2];
  undefined1 local_599;
  basic_variable<std::allocator<char>_> local_598;
  undefined1 local_55b [2];
  undefined1 local_559;
  basic_variable<std::allocator<char>_> local_558;
  undefined1 local_51b [2];
  undefined1 local_519;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  undefined1 local_49b [2];
  undefined1 local_499;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_45b [2];
  undefined1 local_459;
  basic_variable<std::allocator<char>_> local_458;
  undefined1 local_41b [2];
  undefined1 local_419;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3db [2];
  undefined1 local_3d9;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_39b [2];
  undefined1 local_399;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35b [2];
  undefined1 local_359;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2db [2];
  undefined1 local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29b [2];
  undefined1 local_299;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25b [2];
  undefined1 local_259;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21b [2];
  undefined1 local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  local_a[0] = trial::dynamic::operator==(&local_48,(char (*) [6])"delta");
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == \"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xbf8,"void equality_suite::compare_u32string_equal_string_literal()",local_a,
             &local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98,L"");
  local_5e[0] = trial::dynamic::operator!=(&local_98,(char (*) [6])"delta");
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != \"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xbf9,"void equality_suite::compare_u32string_equal_string_literal()",local_5e,
             &local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"delta");
  local_9b[0] = trial::dynamic::operator==(&local_d8,(char (*) [1])0x244c37);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == \"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xbfa,"void equality_suite::compare_u32string_equal_string_literal()",local_9b,
             &local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,L"delta");
  local_db[0] = trial::dynamic::operator!=(&local_118,(char (*) [1])0x244c37);
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != \"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xbfb,"void equality_suite::compare_u32string_equal_string_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,L"delta");
  local_11b[0] = trial::dynamic::operator==(&local_158,(char (*) [6])"delta");
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == \"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xbfd,"void equality_suite::compare_u32string_equal_string_literal()",local_11b,
             &local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"delta");
  local_15b[0] = trial::dynamic::operator!=(&local_198,(char (*) [6])"delta");
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != \"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xbfe,"void equality_suite::compare_u32string_equal_string_literal()",local_15b,
             &local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1d8,L"delta");
  local_19b[0] = trial::dynamic::operator==(&local_1d8,(char (*) [5])"zulu");
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == \"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xbff,"void equality_suite::compare_u32string_equal_string_literal()",local_19b,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_218,L"delta");
  local_1db[0] = trial::dynamic::operator!=(&local_218,(char (*) [5])"zulu");
  local_219 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != \"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc00,"void equality_suite::compare_u32string_equal_string_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_258,L"");
  local_21b[0] = trial::dynamic::operator==(&local_258,(wchar_t (*) [6])L"delta");
  local_259 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == L\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc04,"void equality_suite::compare_u32string_equal_string_literal()",local_21b,
             &local_259);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_298,L"");
  local_25b[0] = trial::dynamic::operator!=(&local_298,(wchar_t (*) [6])L"delta");
  local_299 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != L\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc05,"void equality_suite::compare_u32string_equal_string_literal()",local_25b,
             &local_299);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2d8,L"delta");
  local_29b[0] = trial::dynamic::operator==(&local_2d8,(wchar_t (*) [1])0x247f68);
  local_2d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == L\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc06,"void equality_suite::compare_u32string_equal_string_literal()",local_29b,
             &local_2d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,L"delta");
  local_2db[0] = trial::dynamic::operator!=(&local_318,(wchar_t (*) [1])0x247f68);
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != L\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc07,"void equality_suite::compare_u32string_equal_string_literal()",local_2db,
             &local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"delta");
  local_31b[0] = trial::dynamic::operator==(&local_358,(wchar_t (*) [6])L"delta");
  local_359 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == L\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc09,"void equality_suite::compare_u32string_equal_string_literal()",local_31b,
             &local_359);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_398,L"delta");
  local_35b[0] = trial::dynamic::operator!=(&local_398,(wchar_t (*) [6])L"delta");
  local_399 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != L\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc0a,"void equality_suite::compare_u32string_equal_string_literal()",local_35b,
             &local_399);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3d8,L"delta");
  local_39b[0] = trial::dynamic::operator==(&local_3d8,(wchar_t (*) [5])L"zulu");
  local_3d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == L\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc0b,"void equality_suite::compare_u32string_equal_string_literal()",local_39b,
             &local_3d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_418,L"delta");
  local_3db[0] = trial::dynamic::operator!=(&local_418,(wchar_t (*) [5])L"zulu");
  local_419 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != L\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc0c,"void equality_suite::compare_u32string_equal_string_literal()",local_3db,
             &local_419);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_458,L"");
  local_41b[0] = trial::dynamic::operator==(&local_458,(char16_t (*) [6])L"delta");
  local_459 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == u\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc10,"void equality_suite::compare_u32string_equal_string_literal()",local_41b,
             &local_459);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_498,L"");
  local_45b[0] = trial::dynamic::operator!=(&local_498,(char16_t (*) [6])L"delta");
  local_499 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != u\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc11,"void equality_suite::compare_u32string_equal_string_literal()",local_45b,
             &local_499);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4d8,L"delta");
  local_49b[0] = trial::dynamic::operator==(&local_4d8,(char16_t (*) [1])0x247fba);
  local_4d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc12,"void equality_suite::compare_u32string_equal_string_literal()",local_49b,
             &local_4d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_518,L"delta");
  local_4db[0] = trial::dynamic::operator!=(&local_518,(char16_t (*) [1])0x247fba);
  local_519 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc13,"void equality_suite::compare_u32string_equal_string_literal()",local_4db,
             &local_519);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_558,L"delta");
  local_51b[0] = trial::dynamic::operator==(&local_558,(char16_t (*) [6])L"delta");
  local_559 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == u\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc15,"void equality_suite::compare_u32string_equal_string_literal()",local_51b,
             &local_559);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_598,L"delta");
  local_55b[0] = trial::dynamic::operator!=(&local_598,(char16_t (*) [6])L"delta");
  local_599 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != u\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc16,"void equality_suite::compare_u32string_equal_string_literal()",local_55b,
             &local_599);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5d8,L"delta");
  local_59b[0] = trial::dynamic::operator==(&local_5d8,(char16_t (*) [5])L"zulu");
  local_5d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == u\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc17,"void equality_suite::compare_u32string_equal_string_literal()",local_59b,
             &local_5d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_618,L"delta");
  local_5db[0] = trial::dynamic::operator!=(&local_618,(char16_t (*) [5])L"zulu");
  local_619 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != u\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc18,"void equality_suite::compare_u32string_equal_string_literal()",local_5db,
             &local_619);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_658,L"");
  local_61b[0] = trial::dynamic::operator==(&local_658,(char32_t (*) [6])L"delta");
  local_659 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") == U\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc1c,"void equality_suite::compare_u32string_equal_string_literal()",local_61b,
             &local_659);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_698,L"");
  local_65b[0] = trial::dynamic::operator!=(&local_698,(char32_t (*) [6])L"delta");
  local_699 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"\") != U\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc1d,"void equality_suite::compare_u32string_equal_string_literal()",local_65b,
             &local_699);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6d8,L"delta");
  local_69b[0] = trial::dynamic::operator==(&local_6d8,(char32_t (*) [1])0x247f68);
  local_6d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == U\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc1e,"void equality_suite::compare_u32string_equal_string_literal()",local_69b,
             &local_6d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_718,L"delta");
  local_6db[0] = trial::dynamic::operator!=(&local_718,(char32_t (*) [1])0x247f68);
  local_719 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != U\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc1f,"void equality_suite::compare_u32string_equal_string_literal()",local_6db,
             &local_719);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_758,L"delta");
  local_71b[0] = trial::dynamic::operator==(&local_758,(char32_t (*) [6])L"delta");
  local_759 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == U\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc21,"void equality_suite::compare_u32string_equal_string_literal()",local_71b,
             &local_759);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_798,L"delta");
  local_75b[0] = trial::dynamic::operator!=(&local_798,(char32_t (*) [6])L"delta");
  local_799 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != U\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc22,"void equality_suite::compare_u32string_equal_string_literal()",local_75b,
             &local_799);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_7d8,L"delta");
  local_79b[0] = trial::dynamic::operator==(&local_7d8,(char32_t (*) [5])L"zulu");
  local_7d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") == U\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc23,"void equality_suite::compare_u32string_equal_string_literal()",local_79b,
             &local_7d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_818,L"delta");
  local_7db[0] = trial::dynamic::operator!=(&local_818,(char32_t (*) [5])L"zulu");
  local_819 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") != U\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc24,"void equality_suite::compare_u32string_equal_string_literal()",local_7db,
             &local_819);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_818);
  return;
}

Assistant:

void compare_u32string_equal_string_literal()
{
    // u32string - string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == "delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != "delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == "", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != "", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == "delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != "delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == "zulu", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != "zulu", true);
    }
    // u32string - wstring literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == L"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != L"delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == L"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != L"", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == L"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != L"delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == L"zulu", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != L"zulu", true);
    }
    // u32string - u16string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == u"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != u"delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == u"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != u"", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == u"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != u"delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == u"zulu", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != u"zulu", true);
    }
    // u32string - u32string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") == U"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"") != U"delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == U"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != U"", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == U"delta", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != U"delta", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") == U"zulu", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") != U"zulu", true);
    }
}